

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O3

string * __thiscall
iDynTree::Material::texture_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_texture)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_texture)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Material::texture() const { return m_texture; }